

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ellipsoid.cpp
# Opt level: O2

pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> * __thiscall
OpenMD::Ellipsoid::getBoundingBox
          (pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *__return_storage_ptr__,
          Ellipsoid *this)

{
  Vector3d r;
  Vector<double,_3U> local_50;
  Vector<double,_3U> local_38;
  
  std::pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_>::
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>,_true>(__return_storage_ptr__);
  local_38.data_[0] = this->rAxial_;
  if (this->rAxial_ <= this->rEquatorial_) {
    local_38.data_[0] = this->rEquatorial_;
  }
  Vector<double,_3U>::Vector(&local_38);
  local_38.data_[1] = local_38.data_[0];
  local_38.data_[2] = local_38.data_[0];
  operator-(&local_50,&(this->origin_).super_Vector<double,_3U>,&local_38);
  Vector3<double>::operator=(&__return_storage_ptr__->first,&local_50);
  OpenMD::operator+(&local_50,&(this->origin_).super_Vector<double,_3U>,&local_38);
  Vector3<double>::operator=(&__return_storage_ptr__->second,&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::pair<Vector3d, Vector3d> Ellipsoid::getBoundingBox() {
    std::pair<Vector3d, Vector3d> boundary;
    // make a cubic box
    RealType rad = rAxial_ > rEquatorial_ ? rAxial_ : rEquatorial_;
    Vector3d r(rad, rad, rad);
    boundary.first  = origin_ - r;
    boundary.second = origin_ + r;
    return boundary;
  }